

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O2

void char_mods_callback(GLFWwindow *window,uint codepoint,wchar_t mods)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  char *pcVar4;
  double dVar5;
  
  pvVar3 = glfwGetWindowUserPointer(window);
  uVar2 = counter;
  counter = counter + 1;
  uVar1 = *(uint *)((long)pvVar3 + 8);
  dVar5 = glfwGetTime();
  get_character_string(codepoint);
  pcVar4 = get_mods_name(mods);
  printf("%08x to %i at %0.3f: Character 0x%08x (%s) with modifiers (with%s) input\n",dVar5,
         (ulong)uVar2,(ulong)uVar1,codepoint,get_character_string::result,pcVar4);
  return;
}

Assistant:

static void char_mods_callback(GLFWwindow* window, unsigned int codepoint, int mods)
{
    Slot* slot = glfwGetWindowUserPointer(window);
    printf("%08x to %i at %0.3f: Character 0x%08x (%s) with modifiers (with%s) input\n",
            counter++, slot->number, glfwGetTime(), codepoint,
            get_character_string(codepoint),
            get_mods_name(mods));
}